

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

bool CSOAA::test_ldf_sequence(ldf *data,size_t start_K,multi_ex *ec_seq)

{
  pointer ppeVar1;
  example *ec;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  ostream *poVar5;
  vw_exception *this;
  string sStack_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar2 = 1;
  if ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3 != start_K) {
    bVar2 = (*(code *)PTR_test_label_002abdb0)(&ppeVar1[start_K]->l);
  }
  while( true ) {
    ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3) <= start_K) {
      return (bool)(bVar2 & 1);
    }
    ec = ppeVar1[start_K];
    bVar3 = (*(code *)PTR_test_label_002abdb0)(&ec->l);
    if (bVar3 != (bVar2 & 1)) {
      poVar5 = std::operator<<(&(data->all->trace_message).super_ostream,
                               "warning: ldf example has mix of train/test data; assuming test");
      std::endl<char,std::char_traits<char>>(poVar5);
      bVar2 = 1;
    }
    bVar4 = COST_SENSITIVE::ec_is_example_header(ec);
    if (bVar4) break;
    start_K = start_K + 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar5 = std::operator<<(&local_1a8,"warning: example headers at position ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,": can only have in initial position!");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/csoaa.cc"
             ,0x11d,&sStack_1d8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

bool test_ldf_sequence(ldf& data, size_t start_K, multi_ex& ec_seq)
{
  bool isTest;
  if (start_K == ec_seq.size())
    isTest = true;
  else
    isTest = COST_SENSITIVE::cs_label.test_label(&ec_seq[start_K]->l);
  for (size_t k = start_K; k < ec_seq.size(); k++)
  {
    example* ec = ec_seq[k];
    // Each sub-example must have just one cost
    assert(ec->l.cs.costs.size() == 1);

    if (COST_SENSITIVE::cs_label.test_label(&ec->l) != isTest)
    {
      isTest = true;
      data.all->trace_message << "warning: ldf example has mix of train/test data; assuming test" << endl;
    }
    if (ec_is_example_header(*ec))
      THROW("warning: example headers at position " << k << ": can only have in initial position!");
  }
  return isTest;
}